

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

string * findTestDir_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  
  if (findTestDir[abi:cxx11]()::path_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&findTestDir[abi:cxx11]()::path_abi_cxx11_);
    if (iVar1 != 0) {
      findTestDirInternal_abi_cxx11_();
      __cxa_atexit(std::__cxx11::string::~string,&findTestDir[abi:cxx11]()::path_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&findTestDir[abi:cxx11]()::path_abi_cxx11_);
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  return in_RDI;
}

Assistant:

std::string findTestDir() {
    static auto path = findTestDirInternal();
    return path;
}